

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1-format-common.c
# Opt level: O0

void la_format_SEQUENCE_as_json(la_asn1_formatter_params p,la_asn1_formatter_func cb)

{
  uint *puVar1;
  code *in_RDI;
  long in_stack_00000018;
  long in_stack_00000020;
  void *memb_ptr;
  asn_TYPE_member_t *elm;
  int edx;
  la_asn1_formatter_params cb_p;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  long local_48;
  int local_34;
  undefined1 local_30 [16];
  undefined8 local_20;
  long lStack_18;
  code *local_8;
  
  local_8 = in_RDI;
  memcpy(local_30,&stack0x00000008,0x28);
  la_json_object_start
            ((la_vstring *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_34 = 0;
  do {
    if (*(int *)(in_stack_00000018 + 0x90) <= local_34) {
      la_json_object_end((la_vstring *)0x176a91);
      return;
    }
    puVar1 = (uint *)(*(long *)(in_stack_00000018 + 0x88) + (long)local_34 * 0x40);
    if ((*puVar1 & 1) == 0) {
      local_48 = in_stack_00000020 + (int)puVar1[2];
LAB_00176a38:
      local_20 = *(undefined8 *)(puVar1 + 6);
      lStack_18 = local_48;
      (*local_8)();
    }
    else {
      local_48 = *(long *)(in_stack_00000020 + (int)puVar1[2]);
      if (local_48 != 0) goto LAB_00176a38;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void la_format_SEQUENCE_as_json(la_asn1_formatter_params p, la_asn1_formatter_func cb) {
	la_asn1_formatter_params cb_p = p;
	la_json_object_start(p.vstr, p.label);
	for(int edx = 0; edx < p.td->elements_count; edx++) {
		asn_TYPE_member_t *elm = &p.td->elements[edx];
		void const *memb_ptr;

		if(elm->flags & ATF_POINTER) {
			memb_ptr = *(void const * const *)((char const *)p.sptr + elm->memb_offset);
			if(!memb_ptr) {
				continue;
			}
		} else {
			memb_ptr = (void const *)((char const *)p.sptr + elm->memb_offset);
		}
		cb_p.td = elm->type;
		cb_p.sptr = memb_ptr;
		cb(cb_p);
	}
	la_json_object_end(p.vstr);
}